

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetPSTATAccessories(ndicapi *pol,int port)

{
  unsigned_long uVar1;
  char (*string) [2];
  
  if (port - 0x31U < 3) {
    string = pol->PstatAccessories + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 0;
    }
    string = pol->PstatPassiveAccessories + (port - 0x41U);
  }
  if ((*string)[0] == '\0') {
    return 0;
  }
  uVar1 = ndiHexToUnsignedLong(*string,2);
  return (int)uVar1;
}

Assistant:

ndicapiExport int ndiGetPSTATAccessories(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatAccessories[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassiveAccessories[port - 'A'];
  }
  else
  {
    return 0;
  }

  if (*dp == '\0')
  {
    return 0;
  }

  return (int)ndiHexToUnsignedLong(dp, 2);
}